

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int internalFormat;
  deUint32 type;
  deUint32 dVar3;
  int width;
  int ndx;
  long lVar4;
  int height;
  int level;
  float fVar5;
  deUint32 tex;
  ContextWrapper *local_c0;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar3 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_c0 = this_00;
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    level = 0;
    do {
      width = (this->super_Texture2DSpecCase).m_width >> ((byte)level & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_Texture2DSpecCase).m_height >> ((byte)level & 0x1f);
      if (height < 2) {
        height = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar4];
        fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar4];
        fVar5 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar4] = (fVar2 - fVar1) * fVar5 + fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar4];
        fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar4];
        fVar5 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar4] = (fVar2 - fVar1) * fVar5 + fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      tcu::TextureLevel::setSize(&levelData,width,height,1);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
      dVar3 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (local_c0,0xde1,level,internalFormat,width,height,0,dVar3,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      level = level + 1;
    } while (level < (this->super_Texture2DSpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}